

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::TasmanianSparseGrid::estimateAnisotropicCoefficients
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,TasmanianSparseGrid *this,
          TypeDepth type,int output)

{
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TasGrid::TasmanianSparseGrid::estimateAnisotropicCoefficients
            ((TypeDepth)this,type,(vector *)(ulong)(uint)output);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> estimateAnisotropicCoefficients(TypeDepth type, int output) const{ std::vector<int> w; estimateAnisotropicCoefficients(type, output, w); return w; }